

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

VariableP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::variable<float>(BuiltinPrecisionTests *this,string *name)

{
  pointer pcVar1;
  Variable<float> *ptr;
  SharedPtrStateBase *extraout_RDX;
  VariableP<float> VVar2;
  
  ptr = (Variable<float> *)operator_new(0x28);
  (ptr->super_Expr<float>).super_ExprBase._vptr_ExprBase = (_func_int **)&PTR__Variable_021aea08;
  (ptr->m_name)._M_dataplus._M_p = (pointer)&(ptr->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ptr->m_name,pcVar1,pcVar1 + name->_M_string_length);
  VariableP<float>::VariableP((VariableP<float> *)this,ptr);
  VVar2.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state =
       extraout_RDX;
  VVar2.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr =
       (Variable<float> *)this;
  return (VariableP<float>)
         VVar2.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}